

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestTheAbilityOfTheCollectionToGrowItsCapacity_Test::TestBody
          (ExtendedDataDictionaryTest_TestTheAbilityOfTheCollectionToGrowItsCapacity_Test *this)

{
  char *pcVar1;
  int iVar2;
  AssertHelper local_148;
  AssertHelper local_140;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  ExtendableDataDictionary data_dictionary;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 *local_98;
  undefined8 *local_90;
  undefined8 local_88;
  FieldDef local_80 [8];
  string local_78 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c8 = &uStack_d8;
  _data_dictionary = bidfx_public_api::tools::ByteBuffer::WriteShort;
  local_d0 = 0;
  uStack_d8 = 0;
  local_98 = &local_a8;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_88 = 0;
  gtest_ar_2.success_ = false;
  gtest_ar_2._1_3_ = 0;
  local_c0 = local_c8;
  local_90 = local_98;
  local_148.data_._0_4_ = bidfx_public_api::price::pixie::ExtendableDataDictionary::size();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","data_dictionary.size()",(int *)&gtest_ar_2,(int *)&local_148
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0xcc,pcVar1);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&gtest_ar_2);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar_2.success_ = false;
    gtest_ar_2._1_3_ = 0;
    local_148.data_._0_4_ = bidfx_public_api::price::pixie::ExtendableDataDictionary::NextFreeFid();
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"0","data_dictionary.NextFreeFid()",(int *)&gtest_ar_2,
               (int *)&local_148);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      for (iVar2 = 1; iVar2 != 0x3e9; iVar2 = iVar2 + 1) {
        std::__cxx11::to_string((string *)&gtest_ar_2,iVar2 + -1);
        std::operator+(&local_50,"Bidder",(string *)&gtest_ar_2);
        bidfx_public_api::price::pixie::FieldDef::FieldDef
                  ((FieldDef *)&gtest_ar,iVar2 + -1,0x53,&local_50,0x31,1);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&gtest_ar_2);
        bidfx_public_api::price::pixie::FieldDef::FieldDef(local_80,(FieldDef *)&gtest_ar);
        bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef
                  (&data_dictionary,local_80);
        std::__cxx11::string::~string(local_78);
        local_148.data_._0_4_ = iVar2;
        local_140.data_._0_4_ = bidfx_public_api::price::pixie::ExtendableDataDictionary::size();
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_2,"i + 1","data_dictionary.size()",(int *)&local_148,
                   (int *)&local_140);
        if (gtest_ar_2.success_ == false) {
          testing::Message::Message((Message *)&local_148);
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                     ,0xd4,pcVar1);
          testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
LAB_0016bd35:
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_148);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar_2.message_);
          std::__cxx11::string::~string((string *)&gtest_ar.message_);
          break;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_2.message_);
        local_148.data_._0_4_ = iVar2;
        local_140.data_._0_4_ =
             bidfx_public_api::price::pixie::ExtendableDataDictionary::NextFreeFid();
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_2,"i + 1","data_dictionary.NextFreeFid()",(int *)&local_148
                   ,(int *)&local_140);
        if (gtest_ar_2.success_ == false) {
          testing::Message::Message((Message *)&local_148);
          if (gtest_ar_2.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar1 = "";
          }
          else {
            pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
                     ,0xd5,pcVar1);
          testing::internal::AssertHelper::operator=(&local_140,(Message *)&local_148);
          goto LAB_0016bd35;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_2.message_);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
      }
      goto LAB_0016bc8f;
    }
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0xcd,pcVar1);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&gtest_ar_2);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_148);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
LAB_0016bc8f:
  ExtendableDataDictionary::~ExtendableDataDictionary(&data_dictionary);
  return;
}

Assistant:

ExtendableDataDictionary CreateExtendableDataDictionary()
{
    ExtendableDataDictionary result = ExtendableDataDictionary();
    result.AddFieldDef(bid2);
    result.AddFieldDef(ask2);
    result.AddFieldDef(bid_size2);
    result.AddFieldDef(ask_size2);
    result.AddFieldDef(status2);
    return result;
}